

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseTools.cpp
# Opt level: O3

uint tonk::inplace_itoa_vitaut_1_cat(char *buf,uint32_t val)

{
  bool bVar1;
  uint uVar2;
  uint32_t uVar3;
  char *pcVar4;
  
  if (val == 0) {
    *buf = '0';
    return 1;
  }
  uVar2 = (LZCOUNT(val) ^ 0x1fU) * 0x4d1 + 0x4d1 >> 0xc;
  uVar2 = (uVar2 - (val < *(uint *)(PowersOf10 + (ulong)uVar2 * 4))) + 1;
  pcVar4 = buf + uVar2;
  uVar3 = val;
  if (99 < val) {
    do {
      val = uVar3 / 100;
      *(undefined2 *)(pcVar4 + -2) = *(undefined2 *)(str100p + (ulong)(uVar3 % 100) * 2);
      pcVar4 = pcVar4 + -2;
      bVar1 = 9999 < uVar3;
      uVar3 = uVar3 / 100;
    } while (bVar1);
  }
  if (val < 10) {
    pcVar4[-1] = str100p[(ulong)val * 2 + 1];
    return uVar2;
  }
  *(undefined2 *)(pcVar4 + -2) = *(undefined2 *)(str100p + (ulong)val * 2);
  return uVar2;
}

Assistant:

unsigned inplace_itoa_vitaut_1_cat(char* buf, uint32_t val)
{
    // Common case of zero
    if (val == 0) {
        buf[0] = '0';
        return 1;
    }

    const unsigned bits = NonzeroLowestBitIndex(val);
    const unsigned t = (bits + 1) * 1233 >> 12;
    const unsigned digits = t + 1 - (val < PowersOf10[t]);

    buf += digits;

    while (val >= 100)
    {
        uint32_t const old = val;

        buf -= 2;
        val /= 100;
#ifdef _MSC_VER
        *(uint16_t*)buf = str100p[old - (val * 100)];
#else
        memcpy(buf, &str100p[old - (val * 100)], sizeof(uint16_t));
#endif
    }

    if (val >= 10)
    {
        buf -= 2;
#ifdef _MSC_VER
        *(uint16_t*)buf = str100p[val];
#else
        memcpy(buf, &str100p[val], sizeof(uint16_t));
#endif
    }
    else
    {
        buf[-1] = (char)(uint8_t)(str100p[val] >> 8);
    }

    return digits;
}